

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O1

pair<std::unique_ptr<pstore::json::details::matcher<pstore::json::null_output>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::json::null_output>_>_>,_bool>
* __thiscall
pstore::json::details::
token_matcher<pstore::json::null_output,_pstore::json::details::null_complete>::consume
          (pair<std::unique_ptr<pstore::json::details::matcher<pstore::json::null_output>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::json::null_output>_>_>,_bool>
           *__return_storage_ptr__,
          token_matcher<pstore::json::null_output,_pstore::json::details::null_complete> *this,
          parser<pstore::json::null_output> *parser,maybe<char,_void> *ch)

{
  undefined1 auVar1 [16];
  bool bVar2;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  ulong uVar6;
  char *pcVar7;
  error_category *peVar8;
  bool bVar9;
  error_code err;
  
  iVar4 = (this->super_matcher<pstore::json::null_output>).state_;
  if (iVar4 == 2) {
    if (ch->valid_ == true) {
      pcVar7 = maybe<char,_void>::operator->(ch);
      pcVar5 = this->text_;
      if (*pcVar7 == *pcVar5) {
        this->text_ = pcVar5 + 1;
        bVar2 = true;
        if (pcVar5[1] != '\0') goto LAB_00180787;
        iVar4 = 3;
        bVar9 = true;
        goto LAB_00180783;
      }
    }
LAB_00180762:
    peVar8 = get_error_category();
    err._M_cat = peVar8;
    err._0_8_ = 0xb;
    bVar3 = parser<pstore::json::null_output>::set_error(parser,err);
    bVar2 = true;
    iVar4 = 1;
    bVar9 = true;
    if (!bVar3) goto LAB_00180787;
  }
  else {
    bVar9 = true;
    bVar2 = true;
    if (iVar4 != 3) {
      if (iVar4 == 1) {
        assert_failed("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/json/json.hpp"
                      ,0x1ad);
      }
      goto LAB_00180787;
    }
    if (ch->valid_ == true) {
      pcVar5 = maybe<char,_void>::operator->(ch);
      iVar4 = isalnum((int)*pcVar5);
      if (iVar4 != 0) goto LAB_00180762;
      bVar9 = false;
    }
    uVar6 = std::_V2::system_category();
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar6;
    bVar2 = parser<pstore::json::null_output>::set_error(parser,(error_code)(auVar1 << 0x40));
    iVar4 = 1;
    if (bVar2) {
      (this->super_matcher<pstore::json::null_output>).state_ = 1;
    }
  }
LAB_00180783:
  bVar2 = bVar9;
  (this->super_matcher<pstore::json::null_output>).state_ = iVar4;
LAB_00180787:
  *(undefined8 *)
   &(__return_storage_ptr__->first)._M_t.
    super___uniq_ptr_impl<pstore::json::details::matcher<pstore::json::null_output>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::json::null_output>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_pstore::json::details::matcher<pstore::json::null_output>_*,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::json::null_output>_>_>
       = 0;
  (__return_storage_ptr__->first)._M_t.
  super___uniq_ptr_impl<pstore::json::details::matcher<pstore::json::null_output>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::json::null_output>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_pstore::json::details::matcher<pstore::json::null_output>_*,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::json::null_output>_>_>
  .super__Head_base<0UL,_pstore::json::details::matcher<pstore::json::null_output>_*,_false>.
  _M_head_impl = (matcher<pstore::json::null_output> *)0x0;
  (__return_storage_ptr__->first)._M_t.
  super___uniq_ptr_impl<pstore::json::details::matcher<pstore::json::null_output>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::json::null_output>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_pstore::json::details::matcher<pstore::json::null_output>_*,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::json::null_output>_>_>
  .
  super__Tuple_impl<1UL,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::json::null_output>_>_>
  .
  super__Head_base<1UL,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::json::null_output>_>,_false>
       = (_Head_base<1UL,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::json::null_output>_>,_false>
          )0x1;
  (__return_storage_ptr__->first)._M_t.
  super___uniq_ptr_impl<pstore::json::details::matcher<pstore::json::null_output>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::json::null_output>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_pstore::json::details::matcher<pstore::json::null_output>_*,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::json::null_output>_>_>
  .super__Head_base<0UL,_pstore::json::details::matcher<pstore::json::null_output>_*,_false>.
  _M_head_impl = (matcher<pstore::json::null_output> *)0x0;
  __return_storage_ptr__->second = bVar2;
  return __return_storage_ptr__;
}

Assistant:

std::pair<typename matcher<Callbacks>::pointer, bool>
            token_matcher<Callbacks, DoneFunction>::consume (parser<Callbacks> & parser,
                                                             maybe<char> ch) {
                bool match = true;
                switch (this->get_state ()) {
                case start_state:
                    if (!ch || *ch != *text_) {
                        this->set_error (parser, error_code::unrecognized_token);
                    } else {
                        ++text_;
                        if (*text_ == '\0') {
                            // We've run out of input text, so ensure that the next character isn't
                            // alpha-numeric.
                            this->set_state (last_state);
                        }
                    }
                    break;
                case last_state:
                    if (ch) {
                        if (std::isalnum (*ch) != 0) {
                            this->set_error (parser, error_code::unrecognized_token);
                            return {nullptr, true};
                        }
                        match = false;
                    }
                    this->set_error (parser, done_ (parser));
                    this->set_state (done_state);
                    break;
                case done_state: PSTORE_ASSERT (false); break;
                }
                return {nullptr, match};
            }